

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

size_t mpn_get_str(uchar *sp,int base,mp_ptr up,mp_size_t un)

{
  uint bits;
  size_t sVar1;
  mpn_base_info info;
  mpn_base_info mStack_38;
  
  if (un < 1) {
    __assert_fail("un > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x521,"size_t mpn_get_str(unsigned char *, int, mp_ptr, mp_size_t)");
  }
  if (up[un + -1] != 0) {
    bits = mpn_base_power_of_two_p(base);
    if (bits != 0) {
      sVar1 = mpn_get_str_bits(sp,bits,up,un);
      return sVar1;
    }
    mpn_get_base_info(&mStack_38,(long)base);
    sVar1 = mpn_get_str_other(sp,base,&mStack_38,up,un);
    return sVar1;
  }
  __assert_fail("up[un-1] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x522,"size_t mpn_get_str(unsigned char *, int, mp_ptr, mp_size_t)");
}

Assistant:

size_t
mpn_get_str (unsigned char *sp, int base, mp_ptr up, mp_size_t un)
{
  unsigned bits;

  assert (un > 0);
  assert (up[un-1] > 0);

  bits = mpn_base_power_of_two_p (base);
  if (bits)
    return mpn_get_str_bits (sp, bits, up, un);
  else
    {
      struct mpn_base_info info;

      mpn_get_base_info (&info, base);
      return mpn_get_str_other (sp, base, &info, up, un);
    }
}